

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::TextBuffer(TextBuffer *this)

{
  Layer *this_00;
  Text local_48;
  TextBuffer *local_10;
  TextBuffer *this_local;
  
  local_10 = this;
  this_00 = (Layer *)operator_new(0xa0);
  Text::Text(&local_48);
  Layer::Layer(this_00,&local_48);
  Text::~Text(&local_48);
  this->base_layer = this_00;
  this->top_layer = this->base_layer;
  return;
}

Assistant:

TextBuffer::TextBuffer() :
  base_layer{new Layer(Text{})},
  top_layer{base_layer} {}